

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

int __thiscall piksel::Image::loadBase64(Image *this,string *encoded)

{
  int iVar1;
  stbi_uc *psVar2;
  uchar *data;
  string decoded;
  string *encoded_local;
  Image *this_local;
  
  stbi_set_flip_vertically_on_load(1);
  base64_decode((string *)&data);
  psVar2 = (stbi_uc *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::length();
  psVar2 = stbi_load_from_memory(psVar2,iVar1,&this->width,&this->height,(int *)0x0,4);
  iVar1 = _load(this,psVar2);
  std::__cxx11::string::~string((string *)&data);
  return iVar1;
}

Assistant:

int Image::loadBase64(std::string encoded) {
	stbi_set_flip_vertically_on_load(1);
	std::string decoded = base64_decode(encoded);
	unsigned char* data = stbi_load_from_memory(reinterpret_cast<const unsigned char *>(decoded.c_str()), decoded.length(), &width, &height, NULL, 4);
	return _load(data);
}